

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter.c
# Opt level: O3

uint8_t * av1_get_obmc_mask(int length)

{
  if (length < 0x10) {
    switch(length) {
    case 1:
      return "@";
    case 2:
      return "-@";
    case 4:
      return "\'2;@";
    case 8:
      return "$*059=@@";
    }
  }
  else {
    if (length == 0x10) {
      return "\"%(+.1468:<=@@@@";
    }
    if (length == 0x20) {
      return "!#$&()+,-/02345789:;<<=>@@@@@@@@";
    }
    if (length == 0x40) {
      return "!\"##$%&\'(()*+,,,-.//0123334456788899::;<<<<<=>>>>>????@@@@@@@@@@";
    }
  }
  return (uint8_t *)0x0;
}

Assistant:

const uint8_t *av1_get_obmc_mask(int length) {
  switch (length) {
    case 1: return obmc_mask_1;
    case 2: return obmc_mask_2;
    case 4: return obmc_mask_4;
    case 8: return obmc_mask_8;
    case 16: return obmc_mask_16;
    case 32: return obmc_mask_32;
    case 64: return obmc_mask_64;
    default: assert(0); return NULL;
  }
}